

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_ADR(coda_cdf_product *product_file,int64_t offset)

{
  int iVar1;
  char local_168 [8];
  char name [257];
  int64_t aedr_head;
  int32_t maxz_entry;
  int32_t nz_entries;
  int64_t azedr_head;
  int32_t maxgr_entry;
  int32_t ngr_entries;
  int32_t num;
  int32_t scope;
  int64_t agredr_head;
  int64_t adr_next;
  int64_t iStack_20;
  int32_t record_type;
  int64_t offset_local;
  coda_cdf_product *product_file_local;
  
  if (offset == 0) {
    product_file_local._4_4_ = 0;
  }
  else {
    iStack_20 = offset;
    offset_local = (int64_t)product_file;
    iVar1 = read_bytes(product_file->raw_product,offset + 8,4,(void *)((long)&adr_next + 4));
    if (iVar1 < 0) {
      product_file_local._4_4_ = -1;
    }
    else {
      swap4((void *)((long)&adr_next + 4));
      if (adr_next._4_4_ == 4) {
        iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0xc,8,&agredr_head);
        if (iVar1 < 0) {
          product_file_local._4_4_ = -1;
        }
        else {
          iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x14,8,&num);
          if (iVar1 < 0) {
            product_file_local._4_4_ = -1;
          }
          else {
            iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x1c,4,
                               &ngr_entries);
            if (iVar1 < 0) {
              product_file_local._4_4_ = -1;
            }
            else {
              iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x20,4,
                                 &maxgr_entry);
              if (iVar1 < 0) {
                product_file_local._4_4_ = -1;
              }
              else {
                iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x24,4,
                                   (void *)((long)&azedr_head + 4));
                if (iVar1 < 0) {
                  product_file_local._4_4_ = -1;
                }
                else {
                  iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x28,4,
                                     &azedr_head);
                  if (iVar1 < 0) {
                    product_file_local._4_4_ = -1;
                  }
                  else {
                    iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x30,8,
                                       &maxz_entry);
                    if (iVar1 < 0) {
                      product_file_local._4_4_ = -1;
                    }
                    else {
                      iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x38,4,
                                         (void *)((long)&aedr_head + 4));
                      if (iVar1 < 0) {
                        product_file_local._4_4_ = -1;
                      }
                      else {
                        iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20 + 0x3c,
                                           4,&aedr_head);
                        if (iVar1 < 0) {
                          product_file_local._4_4_ = -1;
                        }
                        else {
                          iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),
                                             iStack_20 + 0x44,0x100,local_168);
                          if (iVar1 < 0) {
                            product_file_local._4_4_ = -1;
                          }
                          else {
                            name[0xf8] = '\0';
                            rtrim(local_168);
                            swap8(&agredr_head);
                            swap8(&num);
                            swap4(&ngr_entries);
                            swap4(&maxgr_entry);
                            swap4((void *)((long)&azedr_head + 4));
                            swap4(&azedr_head);
                            swap8(&maxz_entry);
                            swap4((void *)((long)&aedr_head + 4));
                            swap4(&aedr_head);
                            if ((agredr_head < 0) || (*(long *)(offset_local + 8) <= agredr_head)) {
                              coda_set_error(-300,"CDF file has invalid offset for ADR record");
                              product_file_local._4_4_ = -1;
                            }
                            else if ((_num < 0) || (*(long *)(offset_local + 8) <= _num)) {
                              coda_set_error(-300,"CDF file has invalid offset for AgrEDR record");
                              product_file_local._4_4_ = -1;
                            }
                            else if (maxgr_entry < 0) {
                              coda_set_error(-300,
                                             "CDF file has invalid attribute number in ADR record");
                              product_file_local._4_4_ = -1;
                            }
                            else if (azedr_head._4_4_ < 0) {
                              coda_set_error(-300,
                                             "CDF file has invalid number of g/rEntries in ADR record"
                                            );
                              product_file_local._4_4_ = -1;
                            }
                            else if ((_maxz_entry < 0) ||
                                    (*(long *)(offset_local + 8) <= _maxz_entry)) {
                              coda_set_error(-300,"CDF file has invalid offset for AzEDR record");
                              product_file_local._4_4_ = -1;
                            }
                            else if ((int)aedr_head._4_4_ < 0) {
                              coda_set_error(-300,
                                             "CDF file has invalid number of zEntries in ADR record"
                                            );
                              product_file_local._4_4_ = -1;
                            }
                            else {
                              stack0xffffffffffffffa0 = _num;
                              if ((ngr_entries & 1U) == 0) {
                                if (azedr_head._4_4_ == 0) {
                                  stack0xffffffffffffffa0 = _maxz_entry;
                                }
                              }
                              else if (aedr_head._4_4_ != 0) {
                                coda_set_error(-300,"gADR record has non-zero NzEntries (%d)",
                                               (ulong)aedr_head._4_4_);
                                return -1;
                              }
                              iVar1 = read_AEDR((coda_cdf_product *)offset_local,
                                                stack0xffffffffffffffa0,local_168,ngr_entries);
                              if (iVar1 == 0) {
                                iVar1 = read_ADR((coda_cdf_product *)offset_local,agredr_head);
                                if (iVar1 == 0) {
                                  product_file_local._4_4_ = 0;
                                }
                                else {
                                  product_file_local._4_4_ = -1;
                                }
                              }
                              else {
                                product_file_local._4_4_ = -1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        coda_set_error(-300,"CDF file has invalid record type (%d) for ADR record",
                       (ulong)adr_next._4_4_);
        product_file_local._4_4_ = -1;
      }
    }
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_ADR(coda_cdf_product *product_file, int64_t offset)
{
    int32_t record_type;
    int64_t adr_next;
    int64_t agredr_head;
    int32_t scope;
    int32_t num;
    int32_t ngr_entries;
    int32_t maxgr_entry;
    int64_t azedr_head;
    int32_t nz_entries;
    int32_t maxz_entry;
    int64_t aedr_head;
    char name[257];

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 4)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for ADR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &adr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 8, &agredr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &scope) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 4, &ngr_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 40, 4, &maxgr_entry) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 8, &azedr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 56, 4, &nz_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 60, 4, &maxz_entry) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&adr_next);
    swap_int64(&agredr_head);
    swap_int32(&scope);
    swap_int32(&num);
    swap_int32(&ngr_entries);
    swap_int32(&maxgr_entry);
    swap_int64(&azedr_head);
    swap_int32(&nz_entries);
    swap_int32(&maxz_entry);
#endif
    if (adr_next < 0 || adr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for ADR record");
        return -1;
    }
    if (agredr_head < 0 || agredr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AgrEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in ADR record");
        return -1;
    }
    if (ngr_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of g/rEntries in ADR record");
        return -1;
    }
    if (azedr_head < 0 || azedr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AzEDR record");
        return -1;
    }
    if (nz_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of zEntries in ADR record");
        return -1;
    }

    aedr_head = agredr_head;
    if (scope & 1)
    {
        if (nz_entries != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "gADR record has non-zero NzEntries (%d)", nz_entries);
            return -1;
        }
    }
    else if (ngr_entries == 0)
    {
        aedr_head = azedr_head;
    }

    if (read_AEDR(product_file, aedr_head, name, scope) != 0)
    {
        return -1;
    }

    if (read_ADR(product_file, adr_next) != 0)
    {
        return -1;
    }

    return 0;
}